

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O3

_Bool oonf_layer2_data_set
                (oonf_layer2_data *l2data,oonf_layer2_origin *origin,oonf_layer2_metadata *meta,
                oonf_layer2_value *input)

{
  undefined8 uVar1;
  undefined8 uVar2;
  oonf_layer2_origin *poVar3;
  oonf_layer2_metadata *poVar4;
  _Bool _Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  poVar4 = l2data->_meta;
  if (meta == (oonf_layer2_metadata *)0x0) {
    meta = poVar4;
    if (poVar4 != (oonf_layer2_metadata *)0x0) goto LAB_0010262d;
    if (((&log_global_mask)[_oonf_layer2_subsystem.logging] & 8) != 0) {
      oonf_log(8,(ulong)_oonf_layer2_subsystem.logging,"src/base/oonf_layer2.c",0x15b,0,0,
               "Tried to set layer2 data without metadata (origin: %s)",origin->name,
               &log_global_mask);
      abort();
    }
    meta = (oonf_layer2_metadata *)0x0;
  }
  else {
    if (poVar4 == (oonf_layer2_metadata *)0x0) {
      poVar4 = (oonf_layer2_metadata *)0x0;
    }
    else {
LAB_0010262d:
      poVar3 = l2data->_origin;
      if ((poVar3 != origin && poVar3 != (oonf_layer2_origin *)0x0) &&
         (origin->priority <= poVar3->priority)) {
        return false;
      }
    }
    _Var5 = true;
    if (poVar4 != meta) goto LAB_00102698;
  }
  auVar6[0] = -(input->boolean == (l2data->_value).boolean);
  auVar6[1] = -((input->addr)._addr[1] == (l2data->_value).addr._addr[1]);
  auVar6[2] = -((input->addr)._addr[2] == (l2data->_value).addr._addr[2]);
  auVar6[3] = -((input->addr)._addr[3] == (l2data->_value).addr._addr[3]);
  auVar6[4] = -((input->addr)._addr[4] == (l2data->_value).addr._addr[4]);
  auVar6[5] = -((input->addr)._addr[5] == (l2data->_value).addr._addr[5]);
  auVar6[6] = -((input->addr)._addr[6] == (l2data->_value).addr._addr[6]);
  auVar6[7] = -((input->addr)._addr[7] == (l2data->_value).addr._addr[7]);
  auVar6[8] = -((input->addr)._addr[8] == (l2data->_value).addr._addr[8]);
  auVar6[9] = -((input->addr)._addr[9] == (l2data->_value).addr._addr[9]);
  auVar6[10] = -((input->addr)._addr[10] == (l2data->_value).addr._addr[10]);
  auVar6[0xb] = -((input->addr)._addr[0xb] == (l2data->_value).addr._addr[0xb]);
  auVar6[0xc] = -((input->addr)._addr[0xc] == (l2data->_value).addr._addr[0xc]);
  auVar6[0xd] = -((input->addr)._addr[0xd] == (l2data->_value).addr._addr[0xd]);
  auVar6[0xe] = -((input->addr)._addr[0xe] == (l2data->_value).addr._addr[0xe]);
  auVar6[0xf] = -((input->addr)._addr[0xf] == (l2data->_value).addr._addr[0xf]);
  uVar1 = *(undefined8 *)((long)&l2data->_value + 0x10);
  uVar2 = *(undefined8 *)&(input->addr)._type;
  auVar7[0] = -((char)uVar2 == (char)uVar1);
  auVar7[1] = -((char)((ulong)uVar2 >> 8) == (char)((ulong)uVar1 >> 8));
  auVar7[2] = -((char)((ulong)uVar2 >> 0x10) == (char)((ulong)uVar1 >> 0x10));
  auVar7[3] = -((char)((ulong)uVar2 >> 0x18) == (char)((ulong)uVar1 >> 0x18));
  auVar7[4] = -((char)((ulong)uVar2 >> 0x20) == (char)((ulong)uVar1 >> 0x20));
  auVar7[5] = -((char)((ulong)uVar2 >> 0x28) == (char)((ulong)uVar1 >> 0x28));
  auVar7[6] = -((char)((ulong)uVar2 >> 0x30) == (char)((ulong)uVar1 >> 0x30));
  auVar7[7] = -((char)((ulong)uVar2 >> 0x38) == (char)((ulong)uVar1 >> 0x38));
  auVar7[8] = 0xff;
  auVar7[9] = 0xff;
  auVar7[10] = 0xff;
  auVar7[0xb] = 0xff;
  auVar7[0xc] = 0xff;
  auVar7[0xd] = 0xff;
  auVar7[0xe] = 0xff;
  auVar7[0xf] = 0xff;
  auVar7 = auVar7 & auVar6;
  _Var5 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) != 0xffff;
LAB_00102698:
  *(undefined8 *)((long)&l2data->_value + 0x10) = *(undefined8 *)&(input->addr)._type;
  uVar1 = *(undefined8 *)((input->addr)._addr + 8);
  (l2data->_value).integer = input->integer;
  *(undefined8 *)((long)&l2data->_value + 8) = uVar1;
  l2data->_meta = meta;
  l2data->_origin = origin;
  return _Var5;
}

Assistant:

bool
oonf_layer2_data_set(struct oonf_layer2_data *l2data, const struct oonf_layer2_origin *origin,
  const struct oonf_layer2_metadata *meta, const union oonf_layer2_value *input) {
  bool changed = false;

  if (meta == NULL) {
    OONF_ASSERT(l2data->_meta != NULL, LOG_LAYER2, "Tried to set layer2 data without metadata (origin: %s)", origin->name);
    meta = l2data->_meta;
  }
  if (l2data->_meta == NULL || l2data->_origin == NULL || l2data->_origin == origin ||
      l2data->_origin->priority < origin->priority) {
    changed = l2data->_meta != meta || memcmp(&l2data->_value, input, sizeof(*input)) != 0;
    memcpy(&l2data->_value, input, sizeof(*input));
    l2data->_meta = meta;
    l2data->_origin = origin;
  }
  return changed;
}